

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::computeSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  Dictionary *pDVar1;
  char *pcVar2;
  element_type *peVar3;
  Dictionary *pDVar4;
  long in_RCX;
  ulong in_RSI;
  int32_t h;
  size_t n;
  size_t j;
  string ngram;
  size_t i;
  Dictionary *in_stack_ffffffffffffff40;
  Dictionary *pDVar5;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar6;
  Dictionary *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool bVar7;
  Dictionary *local_60;
  Dictionary *local_58;
  string local_48 [32];
  Dictionary *local_28;
  long local_20;
  ulong local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::string::size();
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  for (local_28 = (Dictionary *)0x0; pDVar5 = local_28,
      pDVar1 = (Dictionary *)std::__cxx11::string::size(), pDVar5 < pDVar1;
      local_28 = (Dictionary *)
                 ((long)&(local_28->args_).
                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1))
  {
    std::__cxx11::string::string(local_48);
    pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
    if (((int)*pcVar2 & 0xc0U) != 0x80) {
      local_58 = local_28;
      local_60 = (Dictionary *)0x1;
      while( true ) {
        pDVar5 = local_58;
        pDVar1 = (Dictionary *)std::__cxx11::string::size();
        bVar7 = false;
        if (pDVar5 < pDVar1) {
          in_stack_ffffffffffffff60 = local_60;
          peVar3 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x15eab5);
          bVar7 = in_stack_ffffffffffffff60 <= (Dictionary *)(long)peVar3->maxn;
        }
        if (!bVar7) break;
        std::__cxx11::string::operator[](local_10);
        std::__cxx11::string::push_back((char)local_48);
        while( true ) {
          local_58 = (Dictionary *)
                     ((long)&(local_58->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                     1);
          pDVar5 = local_58;
          pDVar1 = (Dictionary *)std::__cxx11::string::size();
          uVar6 = false;
          if (pDVar5 < pDVar1) {
            pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
            uVar6 = ((int)*pcVar2 & 0xc0U) == 0x80;
          }
          if ((bool)uVar6 == false) break;
          std::__cxx11::string::operator[](local_10);
          std::__cxx11::string::push_back((char)local_48);
        }
        pDVar1 = local_60;
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x15ebcb);
        if (((Dictionary *)(long)peVar3->minn <= pDVar1) &&
           ((local_60 != (Dictionary *)0x1 ||
            ((local_28 != (Dictionary *)0x0 &&
             (in_stack_ffffffffffffff40 = local_58,
             pDVar4 = (Dictionary *)std::__cxx11::string::size(),
             in_stack_ffffffffffffff40 != pDVar4)))))) {
          hash(in_stack_ffffffffffffff60,(string *)CONCAT17(uVar6,in_stack_ffffffffffffff58));
          std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x15ec3b);
          pushHash(pDVar5,(vector<int,_std::allocator<int>_> *)pDVar1,
                   (int32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
          if (local_20 != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)pDVar5,(value_type *)pDVar1);
          }
        }
        local_60 = (Dictionary *)
                   ((long)&(((_Vector_base<int,_std::allocator<int>_> *)&local_60->args_)->_M_impl).
                           super__Vector_impl_data._M_start + 1);
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void Dictionary::computeSubwords(
    const std::string& word,
    std::vector<int32_t>& ngrams,
    std::vector<std::string>* substrings) const {

  ngrams.reserve(3ul * word.size());
  for (size_t i = 0; i < word.size(); i++) {
    std::string ngram;
    if ((word[i] & 0xC0) == 0x80) {
      continue;
    }

    for (size_t j = i, n = 1; j < word.size() && n <= args_->maxn; n++) {
      ngram.push_back(word[j++]);
      while (j < word.size() && (word[j] & 0xC0) == 0x80) {
        ngram.push_back(word[j++]);
      }
      if (n >= args_->minn && !(n == 1 && (i == 0 || j == word.size()))) {
        int32_t h = hash(ngram) % args_->bucket;
        pushHash(ngrams, h);
        if (substrings) {
          substrings->push_back(ngram);
        }
      }
    }
  }
}